

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O3

void __thiscall DCFGReader::readSymbols(DCFGReader *this,int file_id,Addr baseAddr,json *array)

{
  bool bVar1;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *piVar2;
  reference pbVar3;
  reference pvVar4;
  Addr AVar5;
  mapped_type *pmVar6;
  iterator result;
  iterator result_1;
  undefined1 local_c8 [16];
  undefined1 auStack_b8 [24];
  int local_a0;
  Addr local_98;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_90;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_70;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_50;
  
  local_98 = baseAddr;
  if (array->m_type == array) {
    local_c8._8_8_ = (_Base_ptr)0x0;
    auStack_b8._0_8_ =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    auStack_b8._8_8_ = 0x8000000000000000;
    local_c8._0_8_ = array;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::set_begin((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)local_c8);
    piVar2 = nlohmann::detail::
             iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)local_c8);
    local_50.m_object = piVar2->m_object;
    local_50.m_it.primitive_iterator.m_it = (piVar2->m_it).primitive_iterator.m_it;
    local_50.m_it.object_iterator._M_node = (piVar2->m_it).object_iterator._M_node;
    local_50.m_it.array_iterator._M_current = (piVar2->m_it).array_iterator._M_current;
    local_90.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_90.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    local_90.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_90.m_object = array;
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::set_end(&local_90);
    local_70.m_object = local_90.m_object;
    local_70.m_it.object_iterator._M_node = local_90.m_it.object_iterator._M_node;
    local_70.m_it.array_iterator._M_current = local_90.m_it.array_iterator._M_current;
    local_70.m_it.primitive_iterator.m_it = local_90.m_it.primitive_iterator.m_it;
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==(&local_50,&local_70);
    if (!bVar1) {
      do {
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*(&local_50);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::at(pbVar3,1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   pvVar4);
        AVar5 = str2addr((string *)local_c8);
        if ((json *)local_c8._0_8_ != (json *)auStack_b8) {
          operator_delete((void *)local_c8._0_8_);
        }
        local_c8._0_4_ = file_id;
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*(&local_50);
        pvVar4 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::at(pbVar3,0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_c8 + 8),pvVar4);
        local_a0 = -1;
        local_90.m_object = (pointer)(local_98 + AVar5);
        pmVar6 = std::
                 map<unsigned_long,_DCFGReader::Symbol,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_DCFGReader::Symbol>_>_>
                 ::operator[](&this->m_symbols,(key_type *)&local_90);
        pmVar6->file_id = local_c8._0_4_;
        std::__cxx11::string::operator=((string *)&pmVar6->fname,(string *)(local_c8 + 8));
        pmVar6->lineno = local_a0;
        if ((_Base_ptr)local_c8._8_8_ != (_Base_ptr)(auStack_b8 + 8)) {
          operator_delete((void *)local_c8._8_8_);
        }
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator++(&local_50);
        bVar1 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator==(&local_50,&local_70);
      } while (!bVar1);
    }
    return;
  }
  __assert_fail("array.is_array()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                ,0x125,"void DCFGReader::readSymbols(int, Addr, json &)");
}

Assistant:

void DCFGReader::readSymbols(int file_id, Addr baseAddr, json& array) {
	json::iterator it, ed;

	assert(array.is_array());

	for (it = ++(array.begin()), ed = array.end(); it != ed; ++it) {
		Addr addr = str2addr((*it).at(1));
		m_symbols[baseAddr + addr] = (DCFGReader::Symbol) {
			.file_id = file_id,
			.fname = (*it).at(0),
			.lineno = -1
		};
	}
}